

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O0

void __thiscall wasm::ExtractFunction::run(ExtractFunction *this,Module *module)

{
  PassRunner *this_00;
  char *in_R8;
  Name name_00;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  undefined1 local_28 [8];
  Name name;
  Module *module_local;
  ExtractFunction *this_local;
  
  name.super_IString.str._M_str = (char *)module;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"extract-function",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"ExtractFunction usage:  wasm-opt --extract-function=FUNCTION_NAME"
             ,&local_a1);
  Pass::getArgument(&local_48,&this->super_Pass,&local_68,&local_a0);
  wasm::Name::Name((Name *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  this_00 = Pass::getPassRunner(&this->super_Pass);
  name_00.super_IString.str._M_str = in_R8;
  name_00.super_IString.str._M_len = name.super_IString.str._M_len;
  wasm::extract((wasm *)this_00,(PassRunner *)name.super_IString.str._M_str,(Module *)local_28,
                name_00);
  return;
}

Assistant:

void run(Module* module) override {
    Name name = getArgument(
      "extract-function",
      "ExtractFunction usage:  wasm-opt --extract-function=FUNCTION_NAME");
    extract(getPassRunner(), module, name);
  }